

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

void __thiscall Parse::Object::setPosition(Object *this,string *anchor,string *coordN)

{
  bool bVar1;
  Position *this_00;
  char *pcVar2;
  string *coordN_local;
  string *anchor_local;
  Object *this_local;
  
  if (this->position == (Position *)0x0) {
    this_00 = (Position *)operator_new(0x40);
    memset(this_00,0,0x40);
    Position::Position(this_00);
    this->position = this_00;
  }
  bVar1 = std::operator==(anchor,"x");
  if (bVar1) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::string::operator=((string *)this->position,pcVar2);
  }
  bVar1 = std::operator==(anchor,"y");
  if (bVar1) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::string::operator=((string *)this->position,pcVar2);
  }
  return;
}

Assistant:

void setPosition(std::string anchor, std::string coordN) {
                if (position == NULL) {
                    position = new Position();
                }
                if (anchor == "x") {
                    position->x = (coordN.c_str());
                }
                if (anchor == "y") {
                    position->x = (coordN.c_str());
                }
            }